

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralAttributeCheck.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::GeneralAttributeCheck::checkAttributes
          (GeneralAttributeCheck *this,DOMElement *elem,unsigned_short elemContext,
          TraverseSchema *schema,bool isTopLevel,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  short *psVar1;
  short sVar2;
  short sVar3;
  XMLCh XVar4;
  XMLCh XVar5;
  XMLSize_t XVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  short *psVar8;
  long *plVar9;
  long lVar10;
  DOMNode *pDVar11;
  XMLCh *str1;
  XMLCh *pXVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  unsigned_short *puVar13;
  ulong uVar14;
  undefined4 extraout_var_05;
  short *psVar15;
  long lVar16;
  XMLCh *pXVar17;
  long lVar18;
  XMLByte attList [34];
  char local_58 [40];
  XMLCh *text1;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
    nonXSAttList->fCurCount = 0;
  }
  if (0x31 < elemContext) {
    return;
  }
  if (elem == (DOMElement *)0x0) {
    return;
  }
  if (fAttMap == (ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher> *)0x0) {
    return;
  }
  iVar7 = (*(elem->super_DOMNode)._vptr_DOMNode[0x18])(elem);
  text1 = (XMLCh *)CONCAT44(extraout_var,iVar7);
  iVar7 = (*(elem->super_DOMNode)._vptr_DOMNode[0x16])(elem);
  psVar8 = (short *)CONCAT44(extraout_var_00,iVar7);
  if (psVar8 != &SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
    if (psVar8 == (short *)0x0) {
      psVar8 = &SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
LAB_00312078:
      if (*psVar8 == 0) goto LAB_003120a6;
    }
    else {
      psVar15 = &SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      do {
        sVar2 = *psVar15;
        if (sVar2 == 0) goto LAB_00312078;
        psVar15 = psVar15 + 1;
        sVar3 = *psVar8;
        psVar8 = psVar8 + 1;
      } while (sVar2 == sVar3);
    }
    TraverseSchema::reportSchemaError
              (schema,elem,L"http://apache.org/xml/messages/XMLErrors",0x94,text1,(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0);
  }
LAB_003120a6:
  iVar7 = (*(elem->super_DOMNode)._vptr_DOMNode[0xb])();
  plVar9 = (long *)CONCAT44(extraout_var_01,iVar7);
  lVar10 = (**(code **)(*plVar9 + 0x28))(plVar9);
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  if (lVar10 != 0) {
    lVar18 = 0;
    do {
      pDVar11 = (DOMNode *)(**(code **)(*plVar9 + 0x18))(plVar9,lVar18);
      iVar7 = (*pDVar11->_vptr_DOMNode[2])(pDVar11);
      str1 = (XMLCh *)CONCAT44(extraout_var_02,iVar7);
      if (str1 != L"xmlns") {
        pXVar12 = L"xmlns";
        if (str1 == (XMLCh *)0x0) {
LAB_00312164:
          if (*pXVar12 == L'\0') goto LAB_003123d1;
        }
        else {
          pXVar12 = L"xmlns";
          pXVar17 = str1;
          do {
            XVar4 = *pXVar17;
            if (XVar4 == L'\0') goto LAB_00312164;
            pXVar17 = pXVar17 + 1;
            XVar5 = *pXVar12;
            pXVar12 = pXVar12 + 1;
          } while (XVar4 == XVar5);
        }
        lVar16 = 0;
        do {
          psVar8 = (short *)((long)&XMLUni::fgXMLNSColonString + lVar16);
          lVar16 = lVar16 + 2;
        } while (*psVar8 != 0);
        iVar7 = XMLString::compareNString(str1,L"xmlns:",(lVar16 >> 1) - 1);
        if (iVar7 != 0) {
          if ((((XMLCh)(*str1 | 0x20U) == 0x78) && ((XMLCh)(str1[1] | 0x20U) == 0x6d)) &&
             ((XMLCh)(str1[2] | 0x20U) == 0x6c)) goto LAB_003121bb;
          iVar7 = (*pDVar11->_vptr_DOMNode[0x16])(pDVar11);
          psVar8 = (short *)CONCAT44(extraout_var_03,iVar7);
          if ((psVar8 == (short *)0x0) || (*psVar8 == 0)) {
            iVar7 = (*pDVar11->_vptr_DOMNode[0x18])(pDVar11);
            str1 = (XMLCh *)CONCAT44(extraout_var_04,iVar7);
            puVar13 = ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher>::get
                                (fAttMap,str1,this->fMemoryManager);
            uVar14 = (ulong)*puVar13;
            lVar16 = (ulong)elemContext * 0x40 + (ulong)elemContext * 4;
            if ((fgElemAttTable[uVar14 * 2 + lVar16] & 3) != 0) {
              local_58[uVar14] = '\x01';
              iVar7 = (*pDVar11->_vptr_DOMNode[3])(pDVar11);
              validate(this,elem,str1,(XMLCh *)CONCAT44(extraout_var_05,iVar7),
                       *(ushort *)(fgElemAttTable + uVar14 * 2 + lVar16) & 0x1ffc,schema);
              goto LAB_003123d1;
            }
          }
          else if (psVar8 != &SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
            lVar16 = 0;
            do {
              psVar15 = (short *)((long)psVar8 + lVar16);
              if (*psVar15 == 0) {
                if ((text1 == L"appinfo") ||
                   (*(short *)((long)&SchemaSymbols::fgURI_SCHEMAFORSCHEMA + lVar16) == 0))
                goto LAB_003123cc;
                goto LAB_00312302;
              }
              psVar1 = (short *)((long)&SchemaSymbols::fgURI_SCHEMAFORSCHEMA + lVar16);
              lVar16 = lVar16 + 2;
            } while (*psVar15 == *psVar1);
            if (text1 != L"appinfo") {
LAB_00312302:
              pXVar12 = L"appinfo";
              if (text1 == (XMLCh *)0x0) {
LAB_00312361:
                if ((text1 != L"documentation") && (*pXVar12 != L'\0')) {
LAB_00312370:
                  pXVar12 = L"documentation";
                  if (text1 == (XMLCh *)0x0) {
LAB_003123a3:
                    if (*pXVar12 == L'\0') goto LAB_003123cc;
                  }
                  else {
                    pXVar12 = L"documentation";
                    pXVar17 = text1;
                    do {
                      XVar4 = *pXVar17;
                      if (XVar4 == L'\0') goto LAB_003123a3;
                      pXVar17 = pXVar17 + 1;
                      XVar5 = *pXVar12;
                      pXVar12 = pXVar12 + 1;
                    } while (XVar4 == XVar5);
                  }
LAB_003121bb:
                  if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
                    ValueVectorOf<xercesc_4_0::DOMNode_*>::ensureExtraCapacity(nonXSAttList,1);
                    XVar6 = nonXSAttList->fCurCount;
                    nonXSAttList->fCurCount = XVar6 + 1;
                    nonXSAttList->fElemList[XVar6] = pDVar11;
                  }
                  goto LAB_003123d1;
                }
              }
              else {
                pXVar12 = L"appinfo";
                pXVar17 = text1;
                do {
                  XVar4 = *pXVar17;
                  if (XVar4 == L'\0') goto LAB_00312361;
                  pXVar17 = pXVar17 + 1;
                  XVar5 = *pXVar12;
                  pXVar12 = pXVar12 + 1;
                } while (XVar4 == XVar5);
                if (text1 != L"documentation") goto LAB_00312370;
              }
            }
          }
LAB_003123cc:
          TraverseSchema::reportSchemaError
                    (schema,elem,L"http://apache.org/xml/messages/XMLErrors",0x52 - (uint)isTopLevel
                     ,str1,text1,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
LAB_003123d1:
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar10);
  }
  lVar10 = 0;
  do {
    if (((fgElemAttTable[lVar10 * 2 + (ulong)elemContext * 0x40 + (ulong)elemContext * 4] & 1) != 0)
       && (local_58[lVar10] == '\0')) {
      TraverseSchema::reportSchemaError
                (schema,elem,L"http://apache.org/xml/messages/XMLErrors",0x50 - (uint)isTopLevel,
                 (XMLCh *)(&fAttNames)[lVar10],text1,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x22);
  return;
}

Assistant:

void
GeneralAttributeCheck::checkAttributes(const DOMElement* const elem,
                                       const unsigned short elemContext,
                                       TraverseSchema* const schema,
                                       const bool isTopLevel,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList)
{
    if (nonXSAttList)
        nonXSAttList->removeAllElements();

    if (elem == 0 || !fAttMap || elemContext>=E_Count)
        return;

    const XMLCh* elemName = elem->getLocalName();
    if (!XMLString::equals(SchemaSymbols::fgURI_SCHEMAFORSCHEMA, elem->getNamespaceURI())) {
        schema->reportSchemaError
        (
            elem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::ELTSchemaNS
            , elemName
        );
    }

    DOMNamedNodeMap* eltAttrs = elem->getAttributes();
    const XMLSize_t  attrCount = eltAttrs->getLength();
    XMLByte          attList[A_Count];

    memset(attList, 0, sizeof(attList));

    for (XMLSize_t i = 0; i < attrCount; i++) {

        DOMNode*     attribute = eltAttrs->item(i);
        const XMLCh* attName = attribute->getNodeName();

        // skip namespace declarations
        if (XMLString::equals(attName, XMLUni::fgXMLNSString)
            || XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            continue;

        // Bypass attributes that start with xml
        // add this to the list of "non-schema" attributes
        if ((*attName == chLatin_X || *attName == chLatin_x)
           && (*(attName+1) == chLatin_M || *(attName+1) == chLatin_m)
           && (*(attName+2) == chLatin_L || *(attName+2) == chLatin_l)) {

           if (nonXSAttList)
                nonXSAttList->addElement(attribute);

            continue;
        }

        // for attributes with namespace prefix
        const XMLCh* attrURI = attribute->getNamespaceURI();

        if (attrURI != 0 && *attrURI) {

            // attributes with schema namespace are not allowed
            // and not allowed on "documentation" and "appInfo"
            if (XMLString::equals(attrURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_APPINFO) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_DOCUMENTATION)) {

                schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                          isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                          attName, elemName);
            }
            else if (nonXSAttList)
            {
                nonXSAttList->addElement(attribute);
            }

            continue;
        }

        int attNameId = A_Invalid;
        attName = attribute->getLocalName();

        bool bContinue=false;   // workaround for Borland bug with 'continue' in 'catch'
        try {
            attNameId= fAttMap->get(attName, fMemoryManager);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {

            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
            bContinue=true;
        }
        if(bContinue)
            continue;

        if (fgElemAttTable[elemContext][attNameId] & Att_Mask) {

            attList[attNameId] = 1;
            validate
            (
                elem
                , attName
                , attribute->getNodeValue()
                , fgElemAttTable[elemContext][attNameId] & DV_Mask
                , schema
            );
        }
        else {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
        }
    }

    // ------------------------------------------------------------------
    // Check for required attributes
    // ------------------------------------------------------------------
    for (unsigned int j=0; j < A_Count; j++) {

        if ((fgElemAttTable[elemContext][j] & Att_Required) && attList[j] == 0) {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain, 
                                      isTopLevel?XMLErrs::AttributeRequiredGlobal:XMLErrs::AttributeRequiredLocal, 
                                      fAttNames[j], elemName);
        }
    }
}